

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicBinaryData>::copyInto
          (Property<Protocol::MQTT::Common::DynamicBinaryData> *this,uint8 *buffer)

{
  uint32 uVar1;
  uint32 o;
  uint8 *buffer_local;
  Property<Protocol::MQTT::Common::DynamicBinaryData> *this_local;
  
  *buffer = (this->super_PropertyBase).type;
  uVar1 = Common::DynamicBinaryData::copyInto
                    ((DynamicBinaryData *)&(this->super_PropertyBase).field_0x19,buffer + 1);
  return uVar1 + 1;
}

Assistant:

uint32 copyInto(uint8 * buffer) const { buffer[0] = type; uint32 o = value.copyInto(buffer+1); return o + 1; }